

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

string * __thiscall
setup::filename_map::expand_variables
          (string *__return_storage_ptr__,filename_map *this,it *begin,it end,bool close)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  pointer pcVar4;
  char *pcVar5;
  filename_map *this_00;
  it *piVar6;
  bool bVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  it iVar11;
  string local_80;
  filename_map *local_60;
  it *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60 = this;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar2 = begin->_M_current;
  local_58 = begin;
  do {
    iVar11._M_current = pcVar2;
    pcVar5 = pcVar2;
    if (pcVar2 == end._M_current) {
      return __return_storage_ptr__;
    }
    for (; ((pcVar5 != end._M_current && (iVar11._M_current = pcVar5, *pcVar5 != '{')) &&
           (*pcVar5 != '}')); pcVar5 = pcVar5 + 1) {
      iVar11._M_current = end._M_current;
    }
    uVar10 = __return_storage_ptr__->_M_string_length;
    uVar9 = uVar10;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar10,(char *)0x0,(ulong)pcVar2);
    uVar3 = __return_storage_ptr__->_M_string_length;
    if (uVar10 != uVar3) {
      pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
      do {
        cVar1 = pcVar4[uVar10];
        bVar7 = anon_unknown_0::is_unsafe_path_char::operator()
                          ((is_unsafe_path_char *)(ulong)(uint)(int)cVar1,(char)uVar9);
        cVar8 = '$';
        if (!bVar7) {
          cVar8 = cVar1;
        }
        pcVar4[uVar10] = cVar8;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
    }
    piVar6 = local_58;
    this_00 = local_60;
    local_58->_M_current = iVar11._M_current;
    if (iVar11._M_current == end._M_current) {
      return __return_storage_ptr__;
    }
    pcVar2 = iVar11._M_current + 1;
    local_58->_M_current = pcVar2;
    if (close) {
      if (*iVar11._M_current == '}') {
        return __return_storage_ptr__;
      }
LAB_0013610b:
      if ((pcVar2 == end._M_current) || (*pcVar2 != '{')) {
        expand_variables(&local_50,local_60,local_58,end,true);
        lookup(&local_80,this_00,&local_50);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        piVar6->_M_current = piVar6->_M_current + 1;
      }
    }
    else {
      if (*iVar11._M_current != '}') goto LAB_0013610b;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar2 = piVar6->_M_current;
  } while( true );
}

Assistant:

std::string filename_map::expand_variables(it & begin, it end, bool close) const {
	
	std::string result;
	result.reserve(size_t(end - begin));
	
	while(begin != end) {
		
		// Flush everything before the next bracket
		it pos = begin;
		while(pos != end && *pos != '{' && *pos != '}') {
			++pos;
		}
		ptrdiff_t obegin = ptrdiff_t(result.size());
		result.append(begin, pos);
		std::replace_copy_if(result.begin() + obegin, result.end(), result.begin() + obegin,
		                     is_unsafe_path_char(), '$');
		begin = pos;
		
		if(pos == end) {
			// No more variables or escape sequences
			break;
		}
		
		begin++;
		
		if(close && *pos == '}') {
			// Current context closed
			break;
		}
		
		if(!close && *pos == '}') {
			// literal '}' character
			result.push_back('}');
			continue;
		}
		
		// '{{' escape sequence
		if(begin != end && *begin == '{') {
			result.push_back('{');
			begin++;
			continue;
		}
		
		// Recursively expand variables until we reach the end of this context
		result.append(lookup(expand_variables(begin, end, true)));
	}
	
	return result;
}